

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  Entry entry;
  bool bVar1;
  int iVar2;
  mode_t mVar3;
  size_t sVar4;
  ostream *poVar5;
  archive_entry *entry_00;
  time_t t;
  char *pcVar6;
  size_t size;
  string *this_00;
  Entry e;
  time_t epochTime;
  time_t now;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string *local_208;
  char *file_local;
  string dest;
  char *out;
  cmLocaleRAII localeRAII;
  istringstream iss;
  uint auStack_190 [88];
  
  local_208 = (string *)&this->Error;
  file_local = file;
  std::__cxx11::string::assign((char *)local_208);
  sVar4 = strlen(file);
  if (sVar4 <= skip) {
    return true;
  }
  out = file + skip;
  cmLocaleRAII::cmLocaleRAII(&localeRAII);
  _iss = L"";
  if (prefix != (char *)0x0) {
    _iss = (pointer)prefix;
  }
  cmStrCat<char_const*,char_const*&>(&dest,(char **)&iss,&out);
  if (this->Verbose == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&dest);
    std::operator<<(poVar5,"\n");
  }
  entry_00 = archive_entry_new();
  e.Object = entry_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&now,file,(allocator<char> *)&epochTime);
  cmsys::Encoding::ToWide((wstring *)&iss,(string *)&now);
  archive_entry_copy_sourcepath_w(entry_00,_iss);
  std::__cxx11::wstring::~wstring((wstring *)&iss);
  std::__cxx11::string::~string((string *)&now);
  entry = e;
  cmsys::Encoding::ToWide((wstring *)&iss,&dest);
  archive_entry_copy_pathname_w(entry.Object,_iss);
  std::__cxx11::wstring::~wstring((wstring *)&iss);
  iVar2 = archive_read_disk_entry_from_file(this->Disk,e.Object,-1,(stat *)0x0);
  if (iVar2 == 0) {
    if ((this->MTime)._M_string_length == 0) {
      now = (time_t)&local_218;
      local_220 = 0;
      local_218._M_local_buf[0] = '\0';
      cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)&now);
      if (local_220 != 0) {
        std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&now,_S_in);
        std::istream::_M_extract<long>((long *)&iss);
        if ((*(uint *)((long)auStack_190 + *(long *)(_iss + -6)) & 7) == 2) {
          archive_entry_set_mtime(e.Object,CONCAT71(epochTime._1_7_,(undefined1)epochTime),0);
          archive_entry_set_atime(e.Object,CONCAT71(epochTime._1_7_,(undefined1)epochTime),0);
          archive_entry_set_ctime(e.Object,CONCAT71(epochTime._1_7_,(undefined1)epochTime),0);
          archive_entry_set_birthtime(e.Object,CONCAT71(epochTime._1_7_,(undefined1)epochTime),0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      }
      std::__cxx11::string::~string((string *)&now);
LAB_001200c6:
      if (((this->Uid).IsValueSet == true) && ((this->Gid).IsValueSet == true)) {
        archive_entry_set_uid(e.Object,(long)(this->Uid).Value);
        archive_entry_set_gid(e.Object,(long)(this->Gid).Value);
      }
      if (((this->Uname)._M_string_length != 0) && ((this->Gname)._M_string_length != 0)) {
        archive_entry_set_uname(e.Object,(this->Uname)._M_dataplus._M_p);
        archive_entry_set_gname(e.Object,(this->Gname)._M_dataplus._M_p);
      }
      if ((this->Permissions).IsValueSet == true) {
        archive_entry_set_perm(e.Object,(this->Permissions).Value);
      }
      if ((this->PermissionsMask).IsValueSet == true) {
        mVar3 = archive_entry_perm(e.Object);
        archive_entry_set_perm(e.Object,mVar3 & (this->PermissionsMask).Value);
      }
      archive_entry_acl_clear(e.Object);
      archive_entry_xattr_clear(e.Object);
      archive_entry_set_fflags(e.Object,0,0);
      bVar1 = std::operator==(&this->Format,"pax");
      if ((bVar1) || (bVar1 = std::operator==(&this->Format,"paxr"), bVar1)) {
        archive_entry_sparse_clear(e.Object);
      }
      iVar2 = archive_write_header(this->Archive,e.Object);
      if (iVar2 == 0) {
        pcVar6 = archive_entry_symlink(e.Object);
        bVar1 = true;
        if ((pcVar6 == (char *)0x0) && (size = archive_entry_size(e.Object), size != 0)) {
          bVar1 = AddData(this,file,size);
        }
        goto LAB_00120224;
      }
      cm_archive_error_string_abi_cxx11_((string *)&now,this->Archive);
      cmStrCat<char_const(&)[23],std::__cxx11::string>
                ((string *)&iss,(char (*) [23])"archive_write_header: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now);
      goto LAB_001201fb;
    }
    time(&now);
    t = cm_get_date(now,(this->MTime)._M_dataplus._M_p);
    if (t != -1) {
      archive_entry_set_mtime(e.Object,t,0);
      goto LAB_001200c6;
    }
    epochTime._0_1_ = 0x27;
    cmStrCat<char_const(&)[24],std::__cxx11::string&,char>
              ((string *)&iss,(char (*) [24])"unable to parse mtime \'",&this->MTime,
               (char *)&epochTime);
    this_00 = (string *)&iss;
    std::__cxx11::string::operator=(local_208,this_00);
  }
  else {
    cm_archive_error_string_abi_cxx11_((string *)&now,this->Disk);
    cmStrCat<char_const(&)[27],char_const*&,char_const(&)[4],std::__cxx11::string>
              ((string *)&iss,(char (*) [27])"Unable to read from file \'",&file_local,
               (char (*) [4])"\': ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now);
LAB_001201fb:
    std::__cxx11::string::operator=(local_208,(string *)&iss);
    std::__cxx11::string::~string((string *)&iss);
    this_00 = (string *)&now;
  }
  std::__cxx11::string::~string(this_00);
  bVar1 = false;
LAB_00120224:
  Entry::~Entry(&e);
  std::__cxx11::string::~string((string *)&dest);
  cmLocaleRAII::~cmLocaleRAII(&localeRAII);
  return bVar1;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file, size_t skip, const char* prefix)
{
  this->Error = "";
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if (skip >= strlen(file)) {
    return true;
  }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = cmStrCat(prefix ? prefix : "", out);
  if (this->Verbose) {
    std::cout << dest << "\n";
  }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if (archive_read_disk_entry_from_file(this->Disk, e, -1, nullptr) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("Unable to read from file '", file,
                           "': ", cm_archive_error_string(this->Disk));
    return false;
  }
  if (!this->MTime.empty()) {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1) {
      this->Error = cmStrCat("unable to parse mtime '", this->MTime, '\'');
      return false;
    }
    archive_entry_set_mtime(e, t, 0);
  } else {
    std::string source_date_epoch;
    cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
    if (!source_date_epoch.empty()) {
      std::istringstream iss(source_date_epoch);
      time_t epochTime;
      iss >> epochTime;
      if (iss.eof() && !iss.fail()) {
        // Set all of the file times to the epoch time to handle archive
        // formats that include creation/access time.
        archive_entry_set_mtime(e, epochTime, 0);
        archive_entry_set_atime(e, epochTime, 0);
        archive_entry_set_ctime(e, epochTime, 0);
        archive_entry_set_birthtime(e, epochTime, 0);
      }
    }
  }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet()) {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
  }

  if (!this->Uname.empty() && !this->Gname.empty()) {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
  }

  // manages the permissions
  if (this->Permissions.IsSet()) {
    archive_entry_set_perm(e, this->Permissions.Get());
  }

  if (this->PermissionsMask.IsSet()) {
    int perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
  }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr") {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
  }

  if (archive_write_header(this->Archive, e) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_header: ",
                           cm_archive_error_string(this->Archive));
    return false;
  }

  // do not copy content of symlink
  if (!archive_entry_symlink(e)) {
    // Content.
    if (size_t size = static_cast<size_t>(archive_entry_size(e))) {
      return this->AddData(file, size);
    }
  }
  return true;
}